

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

AnyCellmlElementPtr __thiscall libcellml::Annotator::item(Annotator *this,string *id,size_t index)

{
  bool bVar1;
  AnnotatorImpl *pAVar2;
  reference __r;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  AnyCellmlElementPtr AVar4;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  local_40;
  size_t local_28;
  size_t index_local;
  string *id_local;
  Annotator *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_28 = in_RCX;
  index_local = index;
  id_local = id;
  this_local = this;
  pAVar2 = pFunc((Annotator *)id);
  AnnotatorImpl::update(pAVar2);
  pAVar2 = pFunc((Annotator *)id);
  bVar1 = AnnotatorImpl::exists(pAVar2,(string *)index_local,local_28,false);
  if (bVar1) {
    items(&local_40,(Annotator *)id,(string *)index_local);
    __r = std::
          vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
          ::operator[](&local_40,local_28);
    std::shared_ptr<libcellml::AnyCellmlElement>::shared_ptr
              ((shared_ptr<libcellml::AnyCellmlElement> *)this,__r);
    std::
    vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::~vector(&local_40);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    AVar4 = AnyCellmlElement::AnyCellmlElementImpl::create();
    _Var3 = AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::item(const std::string &id, size_t index)
{
    pFunc()->update();
    return pFunc()->exists(id, index) ? std::move(items(id)[index]) : AnyCellmlElement::AnyCellmlElementImpl::create();
}